

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_nmake.cpp
# Opt level: O1

int __thiscall NmakeMakefileGenerator::init(NmakeMakefileGenerator *this,EVP_PKEY_CTX *ctx)

{
  ProString *pPVar1;
  long lVar2;
  ProFile *pPVar3;
  QMakeProject *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  QVar7;
  Data *pDVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Data *pDVar12;
  undefined1 auVar13 [8];
  bool bVar14;
  bool bVar15;
  int iVar16;
  QList<ProString> *pQVar17;
  ProStringList *pPVar18;
  ProStringList *this_00;
  char *str;
  EVP_PKEY_CTX *pEVar19;
  QArrayData *pQVar20;
  QMakeProject *pQVar21;
  long in_FS_OFFSET;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  QStringView config_02;
  QStringView config_03;
  QStringView config_04;
  QStringView config_05;
  QStringView config_06;
  QStringView config_07;
  QFileInfo targetFileInfo;
  ProString targetBase;
  ProString major_minor;
  ProString version;
  QMakeProject *local_2d8;
  ProString *pPStack_2d0;
  ProFile *local_2c8;
  ProKey local_2b8;
  ProString local_288;
  undefined1 local_258 [24];
  undefined1 local_240 [48];
  Data *local_210;
  QString local_1f8;
  undefined1 *local_1e0;
  ProKey local_1d8;
  ProString local_1a8;
  ProString local_178;
  undefined1 local_148 [8];
  ProString *pPStack_140;
  ProFile *local_138;
  ProString PStack_130;
  undefined1 local_f8 [28];
  int iStack_dc;
  Data *local_d8;
  char16_t *pcStack_d0;
  undefined1 local_c8 [24];
  undefined1 auStack_b0 [48];
  Data *local_80;
  QString *local_78;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_258,"TEMPLATE");
  QMakeEvaluator::first((ProString *)local_c8,&pQVar21->super_QMakeEvaluator,(ProKey *)local_258);
  bVar14 = ProString::operator==((ProString *)local_c8,"app");
  if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
         *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
    UNLOCK();
    if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
      QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
    }
  }
  if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
         *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
    UNLOCK();
    if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
      QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
    }
  }
  if (bVar14) {
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    str = "QMAKE_APP_FLAG";
LAB_002109a4:
    ProKey::ProKey((ProKey *)local_c8,str);
    pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
               super_QList<ProString>;
    ProString::ProString((ProString *)local_258,"1");
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_258);
    QList<ProString>::end(pQVar17);
    if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
      }
    }
    if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
LAB_00210bed:
    Win32MakefileGenerator::processVars(&this->super_Win32MakefileGenerator);
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_c8,"RES_FILE");
    pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8);
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_258,"LIBS");
    this_00 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_258);
    pPVar1 = (pPVar18->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)this_00,pPVar1,
               pPVar1 + (pPVar18->super_QList<ProString>).d.size);
    if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
      }
    }
    if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_c8,"DEF_FILE");
    pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8);
    lVar2 = (pPVar18->super_QList<ProString>).d.size;
    if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
    if (lVar2 != 0) {
      local_f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_258,"DEF_FILE");
      QMakeEvaluator::first
                ((ProString *)local_c8,&pQVar21->super_QMakeEvaluator,(ProKey *)local_258);
      ProString::toQString((QString *)local_148,(ProString *)local_c8);
      MakefileGenerator::fileFixify
                ((QString *)local_f8,(MakefileGenerator *)this,(QString *)local_148,
                 (FileFixifyTypes)0x0,true);
      if (local_148 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_148)->m_caller =
             *(int *)&((QMakeEvaluator *)local_148)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_148)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_148,2,0x10);
        }
      }
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"QMAKE_LFLAGS");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
                 super_QList<ProString>;
      QVar22.m_data = (storage_type *)0x5;
      QVar22.m_size = (qsizetype)local_258;
      QString::fromUtf8(QVar22);
      uVar9 = local_258._16_8_;
      pQVar21 = (QMakeProject *)local_258._0_8_;
      pPVar1 = (ProString *)local_258._8_8_;
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0xc])(&local_178,this,local_f8);
      PStack_130.m_string.d.size = local_178.m_string.d.size;
      PStack_130.m_string.d.ptr = local_178.m_string.d.ptr;
      PStack_130.m_string.d.d = local_178.m_string.d.d;
      local_138 = (ProFile *)uVar9;
      local_178.m_string.d.d = (Data *)0x0;
      local_178.m_string.d.ptr = (char16_t *)0x0;
      local_178.m_string.d.size = 0;
      local_148 = (undefined1  [8])pQVar21;
      pPStack_140 = pPVar1;
      ProString::ProString<QString,QString>
                ((ProString *)local_258,(QStringBuilder<QString,_QString> *)local_148);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_258);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      QStringBuilder<QString,_QString>::~QStringBuilder
                ((QStringBuilder<QString,_QString> *)local_148);
      if (&(local_178.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
           )local_f8._0_8_ !=
          (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
           )0x0) {
        LOCK();
        *(int *)local_f8._0_8_ = *(int *)local_f8._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_f8._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
        }
      }
    }
    local_d8 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_d0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff20 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_c8,"VERSION_PE_HEADER");
    QMakeEvaluator::first((ProString *)local_f8,&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8);
    if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
    if (iStack_dc == 0) {
      auStack_b0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      auStack_b0._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      auStack_b0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_258,"VERSION");
      QMakeEvaluator::first
                ((ProString *)local_c8,&pQVar21->super_QMakeEvaluator,(ProKey *)local_258);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      if (auStack_b0._4_4_ != 0) {
        iVar16 = ProString::indexOf((ProString *)local_c8,".",0,CaseSensitive);
        iVar16 = ProString::indexOf((ProString *)local_c8,".",iVar16 + 1,CaseSensitive);
        ProString::mid((ProString *)local_258,(ProString *)local_c8,0,iVar16);
        QString::operator=((QString *)local_f8,(QString *)local_258);
        stack0xffffffffffffff20 = (Data *)local_240._0_8_;
        local_d8 = (Data *)local_240._8_8_;
        pcStack_d0 = (char16_t *)local_240._16_8_;
        if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
               *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
          UNLOCK();
          if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
            QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
          }
        }
      }
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
    }
    if (iStack_dc != 0) {
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"QMAKE_LFLAGS");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
                 super_QList<ProString>;
      local_148 = (undefined1  [8])0x2adda6;
      pPStack_140 = (ProString *)local_f8;
      ProString::ProString<char_const(&)[10],ProString&>
                ((ProString *)local_258,(QStringBuilder<const_char_(&)[10],_ProString_&> *)local_148
                );
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_258);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
    }
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    pEVar19 = (EVP_PKEY_CTX *)local_c8;
    ProKey::ProKey((ProKey *)pEVar19,"QMAKE_LINK_O_FLAG");
    bVar14 = QMakeProject::isEmpty(pQVar21,(ProKey *)pEVar19);
    if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
        pEVar19 = (EVP_PKEY_CTX *)0x2;
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
    if (bVar14) {
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"QMAKE_LINK_O_FLAG");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
                 super_QList<ProString>;
      ProString::ProString((ProString *)local_258,"/OUT:");
      pEVar19 = (EVP_PKEY_CTX *)(pQVar17->d).size;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(qsizetype)pEVar19,(ProString *)local_258);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          pEVar19 = (EVP_PKEY_CTX *)0x2;
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          pEVar19 = (EVP_PKEY_CTX *)0x2;
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
    }
    MakefileGenerator::init((MakefileGenerator *)this,pEVar19);
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_258,"PRECOMPILED_HEADER");
    QMakeEvaluator::first((ProString *)local_c8,&pQVar21->super_QMakeEvaluator,(ProKey *)local_258);
    pQVar21 = (QMakeProject *)local_148;
    ProString::toQString((QString *)pQVar21,(ProString *)local_c8);
    auVar13 = local_148;
    local_148 = (undefined1  [8])(this->precompH).d.d;
    pPVar1 = (ProString *)(this->precompH).d.ptr;
    (this->precompH).d.d = (Data *)auVar13;
    (this->precompH).d.ptr = (char16_t *)pPStack_140;
    pPStack_140 = pPVar1;
    pPVar3 = (ProFile *)(this->precompH).d.size;
    (this->precompH).d.size = (qsizetype)local_138;
    local_138 = pPVar3;
    if (local_148 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)&((QMakeEvaluator *)local_148)->m_caller)->_q_value).
      super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&((QMakeEvaluator *)local_148)->m_caller)->_q_value).
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&((QMakeEvaluator *)local_148)->m_caller)->_q_value).
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_148,2,0x10);
      }
    }
    if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
    if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
      }
    }
    lVar2 = (this->precompH).d.size;
    if (lVar2 == 0) {
      bVar14 = false;
    }
    else {
      pQVar4 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QVar23.m_data = (storage_type *)0x11;
      QVar23.m_size = (qsizetype)local_c8;
      QString::fromUtf8(QVar23);
      pQVar21 = (QMakeProject *)local_c8._0_8_;
      config.m_data = (storage_type_conflict *)local_c8._8_8_;
      config.m_size = local_c8._16_8_;
      bVar14 = QMakeEvaluator::isActiveConfig(&pQVar4->super_QMakeEvaluator,config,false);
    }
    this->usePCH = bVar14;
    if (pQVar21 != (QMakeProject *)0x0 && lVar2 != 0) {
      LOCK();
      *(int *)&(pQVar21->super_QMakeEvaluator).m_caller =
           *(int *)&(pQVar21->super_QMakeEvaluator).m_caller + -1;
      UNLOCK();
      if (*(int *)&(pQVar21->super_QMakeEvaluator).m_caller == 0) {
        QArrayData::deallocate((QArrayData *)pQVar21,2,0x10);
      }
    }
    lVar2 = (this->precompH).d.size;
    if (lVar2 == 0) {
      bVar14 = false;
    }
    else {
      pQVar4 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QVar24.m_data = (storage_type *)0x13;
      QVar24.m_size = (qsizetype)local_c8;
      QString::fromUtf8(QVar24);
      pQVar21 = (QMakeProject *)local_c8._0_8_;
      config_00.m_data = (storage_type_conflict *)local_c8._8_8_;
      config_00.m_size = local_c8._16_8_;
      bVar14 = QMakeEvaluator::isActiveConfig(&pQVar4->super_QMakeEvaluator,config_00,false);
    }
    this->usePCHC = bVar14;
    if (pQVar21 != (QMakeProject *)0x0 && lVar2 != 0) {
      LOCK();
      *(int *)&(pQVar21->super_QMakeEvaluator).m_caller =
           *(int *)&(pQVar21->super_QMakeEvaluator).m_caller + -1;
      UNLOCK();
      if (*(int *)&(pQVar21->super_QMakeEvaluator).m_caller == 0) {
        QArrayData::deallocate((QArrayData *)pQVar21,2,0x10);
      }
    }
    if (this->usePCH == true) {
      ProKey::ProKey((ProKey *)&local_178,"PRECOMPILED_DIR");
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0x16])(&local_2b8,this,&local_178);
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey(&local_1d8,"TARGET");
      QMakeEvaluator::first(&local_1a8,&pQVar21->super_QMakeEvaluator,&local_1d8);
      local_138 = (ProFile *)local_2b8.super_ProString.m_string.d.size;
      pPStack_140 = (ProString *)local_2b8.super_ProString.m_string.d.ptr;
      local_148 = (undefined1  [8])local_2b8.super_ProString.m_string.d.d;
      local_2b8.super_ProString.m_string.d.d = (Data *)0x0;
      local_2b8.super_ProString.m_string.d.ptr = (char16_t *)0x0;
      local_2b8.super_ProString.m_string.d.size = 0;
      ProString::ProString(&PStack_130,&local_1a8);
      local_258._16_8_ = local_138;
      local_258._8_8_ = pPStack_140;
      local_258._0_8_ = local_148;
      local_148 = (undefined1  [8])0x0;
      pPStack_140 = (ProString *)0x0;
      local_138 = (ProFile *)0x0;
      ProString::ProString((ProString *)local_240,&PStack_130);
      local_c8._16_8_ = local_258._16_8_;
      local_c8._8_8_ = local_258._8_8_;
      local_c8._0_8_ = local_258._0_8_;
      local_210 = (Data *)0x2addca;
      local_258._0_8_ = (Data *)0x0;
      local_258._8_8_ = (char16_t *)0x0;
      local_258._16_8_ = 0;
      ProString::ProString((ProString *)auStack_b0,(ProString *)local_240);
      local_80 = local_210;
      local_78 = &Option::obj_ext;
      QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]>,_QString_&>
      ::convertTo<QString>
                (&local_288.m_string,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]>,_QString_&>
                  *)local_c8);
      pQVar21 = (QMakeProject *)(this->precompObj).d.d;
      pPVar1 = (ProString *)(this->precompObj).d.ptr;
      (this->precompObj).d.d = local_288.m_string.d.d;
      (this->precompObj).d.ptr = local_288.m_string.d.ptr;
      pPVar3 = (ProFile *)(this->precompObj).d.size;
      (this->precompObj).d.size = local_288.m_string.d.size;
      local_288.m_string.d.d = (Data *)pQVar21;
      local_288.m_string.d.ptr = (char16_t *)pPVar1;
      local_288.m_string.d.size = (qsizetype)pPVar3;
      if (pQVar21 != (QMakeProject *)0x0) {
        LOCK();
        (((Type *)&(pQVar21->super_QMakeEvaluator).m_caller)->super___atomic_base<int>)._M_i =
             (((Type *)&(pQVar21->super_QMakeEvaluator).m_caller)->super___atomic_base<int>)._M_i +
             -1;
        UNLOCK();
        if ((((Type *)&(pQVar21->super_QMakeEvaluator).m_caller)->super___atomic_base<int>)._M_i ==
            0) {
          QArrayData::deallocate((QArrayData *)pQVar21,2,0x10);
        }
      }
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_c8);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_258);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_148);
      if (&(local_1a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1a8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      if ((QMakeEvaluator *)local_2b8.super_ProString.m_string.d.d != (QMakeEvaluator *)0x0) {
        LOCK();
        ((local_2b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_2b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_2b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_2b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      if (&(local_178.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      ProKey::ProKey((ProKey *)local_148,"PRECOMPILED_DIR");
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0x16])(&local_288,this,(ProKey *)local_148);
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&local_1a8,"TARGET");
      QMakeEvaluator::first(&local_178,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_1a8);
      local_258._16_8_ = local_288.m_string.d.size;
      local_258._8_8_ = local_288.m_string.d.ptr;
      local_258._0_8_ = local_288.m_string.d.d;
      local_288.m_string.d.d = (Data *)0x0;
      local_288.m_string.d.ptr = (char16_t *)0x0;
      local_288.m_string.d.size = 0;
      ProString::ProString((ProString *)local_240,&local_178);
      local_c8._16_8_ = local_258._16_8_;
      local_c8._8_8_ = local_258._8_8_;
      local_c8._0_8_ = local_258._0_8_;
      local_258._0_8_ = (QMakeProject *)0x0;
      local_258._8_8_ = (ProString *)0x0;
      local_258._16_8_ = (ProFile *)0x0;
      ProString::ProString((ProString *)auStack_b0,(ProString *)local_240);
      local_80 = (Data *)0x2addcf;
      QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[9]>::convertTo<QString>
                ((QString *)&local_1d8,
                 (QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[9]> *)local_c8);
      pQVar20 = &((this->precompPch).d.d)->super_QArrayData;
      pcVar5 = (this->precompPch).d.ptr;
      (this->precompPch).d.d = local_1d8.super_ProString.m_string.d.d;
      (this->precompPch).d.ptr = local_1d8.super_ProString.m_string.d.ptr;
      qVar6 = (this->precompPch).d.size;
      (this->precompPch).d.size = local_1d8.super_ProString.m_string.d.size;
      local_1d8.super_ProString.m_string.d.d = (Data *)pQVar20;
      local_1d8.super_ProString.m_string.d.ptr = pcVar5;
      local_1d8.super_ProString.m_string.d.size = qVar6;
      if (pQVar20 != (QArrayData *)0x0) {
        LOCK();
        (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar20->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar20,2,0x10);
        }
      }
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_c8);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_258);
      if (&(local_178.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1a8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_288.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_288.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_288.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_288.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_288.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_148 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_148)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_148)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_148)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_148,2,0x10);
        }
      }
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QVar25.m_data = &DAT_00000008;
      QVar25.m_size = (qsizetype)local_c8;
      QString::fromUtf8(QVar25);
      uVar9 = local_c8._0_8_;
      config_01.m_data = (storage_type_conflict *)local_c8._8_8_;
      config_01.m_size = local_c8._16_8_;
      bVar14 = QMakeEvaluator::isActiveConfig(&pQVar21->super_QMakeEvaluator,config_01,false);
      if ((QMakeProject *)uVar9 != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)uVar9)->m_caller =
             *(int *)&((QMakeEvaluator *)uVar9)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
        }
      }
      if (!bVar14) {
        ProString::ProString((ProString *)local_c8,&this->precompObj);
        pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
        ProKey::ProKey((ProKey *)local_258,anon_var_dwarf_14400d);
        pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_258)->
                   super_QList<ProString>;
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_c8);
        QList<ProString>::end(pQVar17);
        if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
               *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
          UNLOCK();
          if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
            QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
          }
        }
        if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
               *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
          UNLOCK();
          if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
            QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
          }
        }
      }
      ProString::ProString((ProString *)local_c8,&this->precompPch);
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_258,"QMAKE_CLEAN");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_258)->
                 super_QList<ProString>;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_c8);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      ProString::ProString((ProString *)local_c8,&this->precompObj);
      local_178.m_string.d.d = (Data *)0x0;
      local_178.m_string.d.ptr = (char16_t *)0x0;
      local_178.m_string.d.size = 0;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_178,0,(ProString *)local_c8);
      QList<ProString>::end((QList<ProString> *)&local_178);
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_258,"PRECOMPILED_OBJECT");
      pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_258);
      qVar6 = local_178.m_string.d.size;
      pcVar5 = local_178.m_string.d.ptr;
      pDVar8 = local_178.m_string.d.d;
      local_178.m_string.d.d = (Data *)0x0;
      local_178.m_string.d.ptr = (char16_t *)0x0;
      local_178.m_string.d.size = 0;
      local_148 = (undefined1  [8])(pPVar18->super_QList<ProString>).d.d;
      pPStack_140 = (pPVar18->super_QList<ProString>).d.ptr;
      (pPVar18->super_QList<ProString>).d.d = (Data *)pDVar8;
      (pPVar18->super_QList<ProString>).d.ptr = (ProString *)pcVar5;
      local_138 = (ProFile *)(pPVar18->super_QList<ProString>).d.size;
      (pPVar18->super_QList<ProString>).d.size = qVar6;
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_148);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_178);
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      ProString::ProString((ProString *)local_c8,&this->precompPch);
      local_178.m_string.d.d = (Data *)0x0;
      local_178.m_string.d.ptr = (char16_t *)0x0;
      local_178.m_string.d.size = 0;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_178,0,(ProString *)local_c8);
      QList<ProString>::end((QList<ProString> *)&local_178);
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_258,"PRECOMPILED_PCH");
      pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_258);
      qVar6 = local_178.m_string.d.size;
      pcVar5 = local_178.m_string.d.ptr;
      pDVar8 = local_178.m_string.d.d;
      local_178.m_string.d.d = (Data *)0x0;
      local_178.m_string.d.ptr = (char16_t *)0x0;
      local_178.m_string.d.size = 0;
      local_148 = (undefined1  [8])(pPVar18->super_QList<ProString>).d.d;
      pPStack_140 = (pPVar18->super_QList<ProString>).d.ptr;
      (pPVar18->super_QList<ProString>).d.d = (Data *)pDVar8;
      (pPVar18->super_QList<ProString>).d.ptr = (ProString *)pcVar5;
      local_138 = (ProFile *)(pPVar18->super_QList<ProString>).d.size;
      (pPVar18->super_QList<ProString>).d.size = qVar6;
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_148);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_178);
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
    }
    if (this->usePCHC == true) {
      ProKey::ProKey((ProKey *)&local_178,"PRECOMPILED_DIR");
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0x16])(&local_2b8,this,&local_178);
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey(&local_1d8,"TARGET");
      QMakeEvaluator::first(&local_1a8,&pQVar21->super_QMakeEvaluator,&local_1d8);
      local_138 = (ProFile *)local_2b8.super_ProString.m_string.d.size;
      pPStack_140 = (ProString *)local_2b8.super_ProString.m_string.d.ptr;
      local_148 = (undefined1  [8])local_2b8.super_ProString.m_string.d.d;
      local_2b8.super_ProString.m_string.d.d = (Data *)0x0;
      local_2b8.super_ProString.m_string.d.ptr = (char16_t *)0x0;
      local_2b8.super_ProString.m_string.d.size = 0;
      ProString::ProString(&PStack_130,&local_1a8);
      local_258._16_8_ = local_138;
      local_258._8_8_ = pPStack_140;
      local_258._0_8_ = local_148;
      local_148 = (undefined1  [8])0x0;
      pPStack_140 = (ProString *)0x0;
      local_138 = (ProFile *)0x0;
      ProString::ProString((ProString *)local_240,&PStack_130);
      local_c8._16_8_ = local_258._16_8_;
      local_c8._8_8_ = local_258._8_8_;
      local_c8._0_8_ = local_258._0_8_;
      local_210 = (Data *)0x2addfb;
      local_258._0_8_ = (Data *)0x0;
      local_258._8_8_ = (char16_t *)0x0;
      local_258._16_8_ = 0;
      ProString::ProString((ProString *)auStack_b0,(ProString *)local_240);
      local_80 = local_210;
      local_78 = &Option::obj_ext;
      QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]>,_QString_&>
      ::convertTo<QString>
                (&local_288.m_string,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]>,_QString_&>
                  *)local_c8);
      pQVar21 = (QMakeProject *)(this->precompObjC).d.d;
      pPVar1 = (ProString *)(this->precompObjC).d.ptr;
      (this->precompObjC).d.d = local_288.m_string.d.d;
      (this->precompObjC).d.ptr = local_288.m_string.d.ptr;
      pPVar3 = (ProFile *)(this->precompObjC).d.size;
      (this->precompObjC).d.size = local_288.m_string.d.size;
      local_288.m_string.d.d = (Data *)pQVar21;
      local_288.m_string.d.ptr = (char16_t *)pPVar1;
      local_288.m_string.d.size = (qsizetype)pPVar3;
      if (pQVar21 != (QMakeProject *)0x0) {
        LOCK();
        (((Type *)&(pQVar21->super_QMakeEvaluator).m_caller)->super___atomic_base<int>)._M_i =
             (((Type *)&(pQVar21->super_QMakeEvaluator).m_caller)->super___atomic_base<int>)._M_i +
             -1;
        UNLOCK();
        if ((((Type *)&(pQVar21->super_QMakeEvaluator).m_caller)->super___atomic_base<int>)._M_i ==
            0) {
          QArrayData::deallocate((QArrayData *)pQVar21,2,0x10);
        }
      }
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_c8);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_258);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_148);
      if (&(local_1a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1a8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      if ((QMakeEvaluator *)local_2b8.super_ProString.m_string.d.d != (QMakeEvaluator *)0x0) {
        LOCK();
        ((local_2b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_2b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_2b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_2b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      if (&(local_178.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      ProKey::ProKey((ProKey *)local_148,"PRECOMPILED_DIR");
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0x16])(&local_288,this,(ProKey *)local_148);
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&local_1a8,"TARGET");
      QMakeEvaluator::first(&local_178,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_1a8);
      local_258._16_8_ = local_288.m_string.d.size;
      local_258._8_8_ = local_288.m_string.d.ptr;
      local_258._0_8_ = local_288.m_string.d.d;
      local_288.m_string.d.d = (Data *)0x0;
      local_288.m_string.d.ptr = (char16_t *)0x0;
      local_288.m_string.d.size = 0;
      ProString::ProString((ProString *)local_240,&local_178);
      local_c8._16_8_ = local_258._16_8_;
      local_c8._8_8_ = local_258._8_8_;
      local_c8._0_8_ = local_258._0_8_;
      local_258._0_8_ = (QMakeProject *)0x0;
      local_258._8_8_ = (ProString *)0x0;
      local_258._16_8_ = (ProFile *)0x0;
      ProString::ProString((ProString *)auStack_b0,(ProString *)local_240);
      local_80 = (Data *)0x2ade02;
      QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[11]>::convertTo<QString>
                ((QString *)&local_1d8,
                 (QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[11]> *)local_c8)
      ;
      pQVar20 = &((this->precompPchC).d.d)->super_QArrayData;
      pcVar5 = (this->precompPchC).d.ptr;
      (this->precompPchC).d.d = local_1d8.super_ProString.m_string.d.d;
      (this->precompPchC).d.ptr = local_1d8.super_ProString.m_string.d.ptr;
      qVar6 = (this->precompPchC).d.size;
      (this->precompPchC).d.size = local_1d8.super_ProString.m_string.d.size;
      local_1d8.super_ProString.m_string.d.d = (Data *)pQVar20;
      local_1d8.super_ProString.m_string.d.ptr = pcVar5;
      local_1d8.super_ProString.m_string.d.size = qVar6;
      if (pQVar20 != (QArrayData *)0x0) {
        LOCK();
        (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar20->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar20,2,0x10);
        }
      }
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_c8);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_258);
      if (&(local_178.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_1a8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_288.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_288.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_288.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_288.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_288.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_148 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_148)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_148)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_148)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_148,2,0x10);
        }
      }
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QVar26.m_data = &DAT_00000008;
      QVar26.m_size = (qsizetype)local_c8;
      QString::fromUtf8(QVar26);
      uVar9 = local_c8._0_8_;
      config_02.m_data = (storage_type_conflict *)local_c8._8_8_;
      config_02.m_size = local_c8._16_8_;
      bVar14 = QMakeEvaluator::isActiveConfig(&pQVar21->super_QMakeEvaluator,config_02,false);
      if ((QMakeProject *)uVar9 != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)uVar9)->m_caller =
             *(int *)&((QMakeEvaluator *)uVar9)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
        }
      }
      if (!bVar14) {
        ProString::ProString((ProString *)local_c8,&this->precompObjC);
        pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
        ProKey::ProKey((ProKey *)local_258,anon_var_dwarf_14400d);
        pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_258)->
                   super_QList<ProString>;
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_c8);
        QList<ProString>::end(pQVar17);
        if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
               *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
          UNLOCK();
          if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
            QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
          }
        }
        if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
               *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
          UNLOCK();
          if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
            QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
          }
        }
      }
      ProString::ProString((ProString *)local_c8,&this->precompPchC);
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_258,"QMAKE_CLEAN");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_258)->
                 super_QList<ProString>;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_c8);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      ProString::ProString((ProString *)local_c8,&this->precompObjC);
      local_178.m_string.d.d = (Data *)0x0;
      local_178.m_string.d.ptr = (char16_t *)0x0;
      local_178.m_string.d.size = 0;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_178,0,(ProString *)local_c8);
      QList<ProString>::end((QList<ProString> *)&local_178);
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_258,"PRECOMPILED_OBJECT_C");
      pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_258);
      qVar6 = local_178.m_string.d.size;
      pcVar5 = local_178.m_string.d.ptr;
      pDVar8 = local_178.m_string.d.d;
      local_178.m_string.d.d = (Data *)0x0;
      local_178.m_string.d.ptr = (char16_t *)0x0;
      local_178.m_string.d.size = 0;
      local_148 = (undefined1  [8])(pPVar18->super_QList<ProString>).d.d;
      pPStack_140 = (pPVar18->super_QList<ProString>).d.ptr;
      (pPVar18->super_QList<ProString>).d.d = (Data *)pDVar8;
      (pPVar18->super_QList<ProString>).d.ptr = (ProString *)pcVar5;
      local_138 = (ProFile *)(pPVar18->super_QList<ProString>).d.size;
      (pPVar18->super_QList<ProString>).d.size = qVar6;
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_148);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_178);
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      ProString::ProString((ProString *)local_c8,&this->precompPchC);
      local_178.m_string.d.d = (Data *)0x0;
      local_178.m_string.d.ptr = (char16_t *)0x0;
      local_178.m_string.d.size = 0;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_178,0,(ProString *)local_c8);
      QList<ProString>::end((QList<ProString> *)&local_178);
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_258,"PRECOMPILED_PCH_C");
      pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_258);
      qVar6 = local_178.m_string.d.size;
      pcVar5 = local_178.m_string.d.ptr;
      pDVar8 = local_178.m_string.d.d;
      local_178.m_string.d.d = (Data *)0x0;
      local_178.m_string.d.ptr = (char16_t *)0x0;
      local_178.m_string.d.size = 0;
      local_148 = (undefined1  [8])(pPVar18->super_QList<ProString>).d.d;
      pPStack_140 = (pPVar18->super_QList<ProString>).d.ptr;
      (pPVar18->super_QList<ProString>).d.d = (Data *)pDVar8;
      (pPVar18->super_QList<ProString>).d.ptr = (ProString *)pcVar5;
      local_138 = (ProFile *)(pPVar18->super_QList<ProString>).d.size;
      (pPVar18->super_QList<ProString>).d.size = qVar6;
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_148);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_178);
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
    }
    local_1e0 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_178,"DESTDIR");
    QMakeEvaluator::first
              ((ProString *)local_148,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_178);
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_1d8,"TARGET");
    QMakeEvaluator::first(&local_1a8,&pQVar21->super_QMakeEvaluator,&local_1d8);
    ProString::ProString((ProString *)local_258,(ProString *)local_148);
    ProString::ProString((ProString *)(local_240 + 0x18),&local_1a8);
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_2b8,"TARGET_EXT");
    QMakeEvaluator::first(&local_288,&pQVar21->super_QMakeEvaluator,&local_2b8);
    QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
              ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_c8,
               (QStringBuilder<ProString,_ProString> *)local_258,&local_288);
    QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::convertTo<QString>
              (&local_1f8,
               (QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_c8);
    QFileInfo::QFileInfo((QFileInfo *)&local_1e0,(QString *)&local_1f8);
    if (&(local_1f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_c8);
    if (&(local_288.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_288.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_288.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_288.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_288.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QMakeEvaluator *)local_2b8.super_ProString.m_string.d.d != (QMakeEvaluator *)0x0) {
      LOCK();
      ((local_2b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_2b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_2b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_2b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStringBuilder<ProString,_ProString>::~QStringBuilder
              ((QStringBuilder<ProString,_ProString> *)local_258);
    if (&(local_1a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_1a8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_148 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_148)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_148)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_148)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_148,2,0x10);
      }
    }
    if (&(local_178.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    PStack_130.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    PStack_130.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_138 = (ProFile *)&DAT_aaaaaaaaaaaaaaaa;
    PStack_130.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_148 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    pPStack_140 = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::path();
    uVar11 = local_258._16_8_;
    uVar10 = local_258._8_8_;
    uVar9 = local_258._0_8_;
    local_258._16_8_ = (ProFile *)0x0;
    local_258._0_8_ = (QMakeProject *)0x0;
    local_258._8_8_ = (ProString *)0x0;
    QFileInfo::completeBaseName();
    auStack_b0._24_8_ = local_178.m_string.d.size;
    auStack_b0._16_8_ = local_178.m_string.d.ptr;
    auStack_b0._8_8_ = local_178.m_string.d.d;
    local_c8._0_8_ = uVar9;
    local_c8._8_8_ = uVar10;
    local_c8._16_8_ = uVar11;
    auStack_b0[0] = 0x2f;
    local_178.m_string.d.d = (Data *)0x0;
    local_178.m_string.d.ptr = (char16_t *)0x0;
    local_178.m_string.d.size = 0;
    ProString::ProString<QStringBuilder<QString,char>,QString>
              ((ProString *)local_148,
               (QStringBuilder<QStringBuilder<QString,_char>,_QString> *)local_c8);
    QStringBuilder<QStringBuilder<QString,_char>,_QString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_char>,_QString> *)local_c8);
    if (&(local_178.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
      }
    }
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    pQVar20 = (QArrayData *)local_258;
    ProKey::ProKey((ProKey *)pQVar20,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_c8,&pQVar21->super_QMakeEvaluator,(ProKey *)pQVar20);
    bVar14 = ProString::operator==((ProString *)local_c8,"lib");
    if (bVar14) {
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QVar27.m_data = (storage_type *)0x6;
      QVar27.m_size = (qsizetype)&local_178;
      QString::fromUtf8(QVar27);
      pQVar20 = &(local_178.m_string.d.d)->super_QArrayData;
      config_03.m_data = local_178.m_string.d.ptr;
      config_03.m_size = local_178.m_string.d.size;
      bVar15 = QMakeEvaluator::isActiveConfig(&pQVar21->super_QMakeEvaluator,config_03,false);
    }
    else {
      bVar15 = false;
    }
    if (bVar14 && pQVar20 != (QArrayData *)0x0) {
      LOCK();
      (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar20->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar20->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar20,2,0x10);
      }
    }
    if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
    if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
      }
    }
    if (bVar15 != false) {
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"QMAKE_CLEAN");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
                 super_QList<ProString>;
      local_178.m_string.d.d = (Data *)local_148;
      local_178.m_string.d.ptr = L".exp";
      ProString::ProString<ProString_const&,char_const(&)[5]>
                ((ProString *)local_258,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)&local_178);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_258);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"QMAKE_DISTCLEAN");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
                 super_QList<ProString>;
      local_178.m_string.d.d = (Data *)local_148;
      local_178.m_string.d.ptr = L".lib";
      ProString::ProString<ProString_const&,char_const(&)[5]>
                ((ProString *)local_258,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)&local_178);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_258);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
    }
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QVar28.m_data = (storage_type *)0xa;
    QVar28.m_size = (qsizetype)local_c8;
    QString::fromUtf8(QVar28);
    uVar9 = local_c8._0_8_;
    config_04.m_data = (storage_type_conflict *)local_c8._8_8_;
    config_04.m_size = local_c8._16_8_;
    bVar14 = QMakeEvaluator::isActiveConfig(&pQVar21->super_QMakeEvaluator,config_04,false);
    if ((QMakeProject *)uVar9 != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)uVar9)->m_caller =
           *(int *)&((QMakeEvaluator *)uVar9)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    if (bVar14) {
      local_288.m_string.d.d = (Data *)0x0;
      local_288.m_string.d.ptr = (char16_t *)0x0;
      local_288.m_string.d.size = 0;
      local_2b8.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_2b8.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_2b8.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_c8._0_8_ = local_148;
      local_c8._8_8_ = ".pdb";
      QStringBuilder<const_ProString_&,_const_char_(&)[5]>::convertTo<QString>
                ((QString *)&local_2b8,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)local_c8);
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QVar29.m_data = (storage_type *)0x9;
      QVar29.m_size = (qsizetype)local_c8;
      QString::fromUtf8(QVar29);
      uVar9 = local_c8._0_8_;
      config_05.m_data = (storage_type_conflict *)local_c8._8_8_;
      config_05.m_size = local_c8._16_8_;
      bVar14 = QMakeEvaluator::isActiveConfig(&pQVar21->super_QMakeEvaluator,config_05,false);
      if ((QMakeProject *)uVar9 != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)uVar9)->m_caller =
             *(int *)&((QMakeEvaluator *)uVar9)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
        }
      }
      if (bVar14) {
        QString::operator=(&local_288.m_string,(QString *)&local_2b8);
      }
      else {
        ProKey::ProKey((ProKey *)&local_178,"OBJECTS_DIR");
        (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
          _vptr_QMakeSourceFileInfo[0x16])(&local_2d8,this,&local_178);
        pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
        ProKey::ProKey(&local_1d8,"TARGET");
        QMakeEvaluator::first(&local_1a8,&pQVar21->super_QMakeEvaluator,&local_1d8);
        local_258._16_8_ = local_2c8;
        local_258._8_8_ = pPStack_2d0;
        local_258._0_8_ = local_2d8;
        local_2d8 = (QMakeProject *)0x0;
        pPStack_2d0 = (ProString *)0x0;
        local_2c8 = (ProFile *)0x0;
        ProString::ProString((ProString *)local_240,&local_1a8);
        local_c8._16_8_ = local_258._16_8_;
        local_c8._8_8_ = local_258._8_8_;
        local_c8._0_8_ = local_258._0_8_;
        local_258._0_8_ = (QMakeProject *)0x0;
        local_258._8_8_ = (ProString *)0x0;
        local_258._16_8_ = (ProFile *)0x0;
        ProString::ProString((ProString *)auStack_b0,(ProString *)local_240);
        local_80 = (Data *)0x2ade39;
        QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[8]>::convertTo<QString>
                  (&local_1f8,
                   (QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[8]> *)local_c8
                  );
        qVar6 = local_1f8.d.size;
        pDVar12 = local_1f8.d.d;
        pcVar5 = local_288.m_string.d.ptr;
        pDVar8 = local_288.m_string.d.d;
        local_1f8.d.d = local_288.m_string.d.d;
        local_288.m_string.d.d = pDVar12;
        local_288.m_string.d.ptr = local_1f8.d.ptr;
        local_1f8.d.ptr = pcVar5;
        local_1f8.d.size = local_288.m_string.d.size;
        local_288.m_string.d.size = qVar6;
        if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
          }
        }
        QStringBuilder<QString,_ProString>::~QStringBuilder
                  ((QStringBuilder<QString,_ProString> *)local_c8);
        QStringBuilder<QString,_ProString>::~QStringBuilder
                  ((QStringBuilder<QString,_ProString> *)local_258);
        if (&(local_1a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_1a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_1a8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_2d8 != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&(local_2d8->super_QMakeEvaluator).m_caller =
               *(int *)&(local_2d8->super_QMakeEvaluator).m_caller + -1;
          UNLOCK();
          if (*(int *)&(local_2d8->super_QMakeEvaluator).m_caller == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8,2,0x10);
          }
        }
        if (&(local_178.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      local_178.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_178.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_178.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0xc])(&local_178,this,&local_288);
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"QMAKE_CFLAGS");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
                 super_QList<ProString>;
      local_1a8.m_string.d.d = (Data *)0x2ade41;
      local_1a8.m_string.d.ptr = (char16_t *)&local_178;
      ProString::ProString<char_const(&)[4],QString&>
                ((ProString *)local_258,(QStringBuilder<const_char_(&)[4],_QString_&> *)&local_1a8);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_258);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      uVar9 = local_c8._0_8_;
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"QMAKE_CXXFLAGS");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
                 super_QList<ProString>;
      local_1a8.m_string.d.d = (Data *)0x2ade41;
      local_1a8.m_string.d.ptr = (char16_t *)&local_178;
      ProString::ProString<char_const(&)[4],QString&>
                ((ProString *)local_258,(QStringBuilder<const_char_(&)[4],_QString_&> *)&local_1a8);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_258);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      uVar9 = local_c8._0_8_;
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"QMAKE_CLEAN");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
                 super_QList<ProString>;
      ProString::ProString((ProString *)local_258,&local_288.m_string);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_258);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      uVar9 = local_c8._0_8_;
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"QMAKE_DISTCLEAN");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
                 super_QList<ProString>;
      ProString::ProString((ProString *)local_258,(QString *)&local_2b8);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_258);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      uVar9 = local_c8._0_8_;
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      if (&(local_178.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_178.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QMakeEvaluator *)local_2b8.super_ProString.m_string.d.d != (QMakeEvaluator *)0x0) {
        LOCK();
        ((local_2b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_2b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_2b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_2b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      if (&(local_288.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_288.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_288.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_288.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_288.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QVar30.m_data = (storage_type *)0x5;
    QVar30.m_size = (qsizetype)local_c8;
    QString::fromUtf8(QVar30);
    uVar9 = local_c8._0_8_;
    config_06.m_data = (storage_type_conflict *)local_c8._8_8_;
    config_06.m_size = local_c8._16_8_;
    bVar14 = QMakeEvaluator::isActiveConfig(&pQVar21->super_QMakeEvaluator,config_06,false);
    if ((QMakeProject *)uVar9 != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)uVar9)->m_caller =
           *(int *)&((QMakeEvaluator *)uVar9)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    if (bVar14) {
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"QMAKE_CLEAN");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
                 super_QList<ProString>;
      local_178.m_string.d.d = (Data *)local_148;
      local_178.m_string.d.ptr = L".ilk";
      ProString::ProString<ProString_const&,char_const(&)[5]>
                ((ProString *)local_258,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)&local_178);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_258);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      uVar9 = local_c8._0_8_;
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"QMAKE_CLEAN");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
                 super_QList<ProString>;
      local_178.m_string.d.d = (Data *)local_148;
      local_178.m_string.d.ptr = L".idb";
      ProString::ProString<ProString_const&,char_const(&)[5]>
                ((ProString *)local_258,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)&local_178);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_258);
      QList<ProString>::end(pQVar17);
      if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
        }
      }
      uVar9 = local_c8._0_8_;
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
    }
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_c8,"QMAKE_APP_FLAG");
    pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8);
    lVar2 = (pPVar18->super_QList<ProString>).d.size;
    if (lVar2 == 0) {
      pQVar4 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QVar31.m_data = (storage_type *)0x3;
      QVar31.m_size = (qsizetype)local_258;
      QString::fromUtf8(QVar31);
      pQVar21 = (QMakeProject *)local_258._0_8_;
      config_07.m_data = (storage_type_conflict *)local_258._8_8_;
      config_07.m_size = local_258._16_8_;
      bVar14 = QMakeEvaluator::isActiveConfig(&pQVar4->super_QMakeEvaluator,config_07,false);
    }
    else {
      bVar14 = false;
    }
    if (pQVar21 != (QMakeProject *)0x0 && lVar2 == 0) {
      LOCK();
      *(int *)&(pQVar21->super_QMakeEvaluator).m_caller =
           *(int *)&(pQVar21->super_QMakeEvaluator).m_caller + -1;
      UNLOCK();
      if (*(int *)&(pQVar21->super_QMakeEvaluator).m_caller == 0) {
        QArrayData::deallocate((QArrayData *)pQVar21,2,0x10);
      }
    }
    uVar9 = local_c8._0_8_;
    if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
    if (bVar14 != false) {
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"DEFINES");
      pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
                 super_QList<ProString>;
      uVar9 = local_c8._0_8_;
      if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
             *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
        UNLOCK();
        if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      bVar14 = ProStringList::contains((ProStringList *)pQVar17,"_WINDLL",CaseSensitive);
      if (!bVar14) {
        ProString::ProString((ProString *)local_c8,"_WINDLL");
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_c8);
        QList<ProString>::end(pQVar17);
        uVar9 = local_c8._0_8_;
        if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
               *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
          UNLOCK();
          if (*(int *)&((QMakeEvaluator *)uVar9)->m_caller == 0) {
            QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
          }
        }
      }
    }
    if (local_148 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_148)->m_caller =
           *(int *)&((QMakeEvaluator *)local_148)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_148)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_148,2,0x10);
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_1e0);
    if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
         )local_f8._0_8_ ==
        (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
         )0x0) goto LAB_0021350b;
    LOCK();
    *(int *)local_f8._0_8_ = *(int *)local_f8._0_8_ + -1;
    iVar16 = *(int *)local_f8._0_8_;
    UNLOCK();
    QVar7.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                   )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                     )local_f8._0_8_;
  }
  else {
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_258,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_c8,&pQVar21->super_QMakeEvaluator,(ProKey *)local_258);
    bVar14 = ProString::operator==((ProString *)local_c8,"lib");
    if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
    if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
      }
    }
    if (bVar14) {
      pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      str = "QMAKE_LIB_FLAG";
      goto LAB_002109a4;
    }
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_258,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_c8,&pQVar21->super_QMakeEvaluator,(ProKey *)local_258);
    pEVar19 = (EVP_PKEY_CTX *)0x2b024a;
    bVar14 = ProString::operator==((ProString *)local_c8,"subdirs");
    if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
        pEVar19 = (EVP_PKEY_CTX *)0x2;
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
    if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
        pEVar19 = (EVP_PKEY_CTX *)0x2;
        QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
      }
    }
    if (!bVar14) goto LAB_00210bed;
    MakefileGenerator::init((MakefileGenerator *)this,pEVar19);
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_c8,"MAKEFILE");
    pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8);
    lVar2 = (pPVar18->super_QList<ProString>).d.size;
    if ((QMakeProject *)local_c8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
      }
    }
    if (lVar2 != 0) goto LAB_0021350b;
    pQVar21 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_c8,"MAKEFILE");
    pQVar17 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_c8)->
               super_QList<ProString>;
    ProString::ProString((ProString *)local_258,"Makefile");
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar17,(pQVar17->d).size,(ProString *)local_258);
    QList<ProString>::end(pQVar17);
    if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller =
           *(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller + -1;
      UNLOCK();
      if (*(int *)&((QMakeEvaluator *)local_258._0_8_)->m_caller == 0) {
        QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
      }
    }
    if ((QMakeProject *)local_c8._0_8_ == (QMakeProject *)0x0) goto LAB_0021350b;
    LOCK();
    *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller =
         *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller + -1;
    iVar16 = *(int *)&((QMakeEvaluator *)local_c8._0_8_)->m_caller;
    UNLOCK();
    QVar7.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                   )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                     )local_c8._0_8_;
  }
  if (iVar16 == 0) {
    QArrayData::deallocate((QArrayData *)QVar7.d.ptr,2,0x10);
  }
LAB_0021350b:
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(Data **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void NmakeMakefileGenerator::init()
{
    /* this should probably not be here, but I'm using it to wrap the .t files */
    if(project->first("TEMPLATE") == "app")
        project->values("QMAKE_APP_FLAG").append("1");
    else if(project->first("TEMPLATE") == "lib")
        project->values("QMAKE_LIB_FLAG").append("1");
    else if(project->first("TEMPLATE") == "subdirs") {
        MakefileGenerator::init();
        if(project->values("MAKEFILE").isEmpty())
            project->values("MAKEFILE").append("Makefile");
        return;
    }

    processVars();

    project->values("LIBS") += project->values("RES_FILE");

    if (!project->values("DEF_FILE").isEmpty()) {
        QString defFileName = fileFixify(project->first("DEF_FILE").toQString());
        project->values("QMAKE_LFLAGS").append(QString("/DEF:") + escapeFilePath(defFileName));
    }

    // set /VERSION for EXE/DLL header
    ProString major_minor = project->first("VERSION_PE_HEADER");
    if (major_minor.isEmpty()) {
        ProString version = project->first("VERSION");
        if (!version.isEmpty()) {
            int firstDot = version.indexOf(".");
            int secondDot = version.indexOf(".", firstDot + 1);
            major_minor = version.left(secondDot);
        }
    }
    if (!major_minor.isEmpty())
        project->values("QMAKE_LFLAGS").append("/VERSION:" + major_minor);

    if (project->isEmpty("QMAKE_LINK_O_FLAG"))
        project->values("QMAKE_LINK_O_FLAG").append("/OUT:");

    // Base class init!
    MakefileGenerator::init();

    // Setup PCH variables
    precompH = project->first("PRECOMPILED_HEADER").toQString();
    usePCH = !precompH.isEmpty() && project->isActiveConfig("precompile_header");
    usePCHC = !precompH.isEmpty() && project->isActiveConfig("precompile_header_c");
    if (usePCH) {
        // Created files
        precompObj = var("PRECOMPILED_DIR") + project->first("TARGET") + "_pch" + Option::obj_ext;
        precompPch = var("PRECOMPILED_DIR") + project->first("TARGET") + "_pch.pch";
        // Add linking of precompObj (required for whole precompiled classes)
        // ### For clang_cl we currently let inline methods be generated in the normal objects,
        // since the PCH object is buggy (as of clang 8.0.0)
        if (!project->isActiveConfig("clang_cl"))
            project->values("OBJECTS") += precompObj;
        // Add pch file to cleanup
        project->values("QMAKE_CLEAN") += precompPch;
        // Return to variable pool
        project->values("PRECOMPILED_OBJECT") = ProStringList(precompObj);
        project->values("PRECOMPILED_PCH")    = ProStringList(precompPch);
    }
    if (usePCHC) {
        precompObjC = var("PRECOMPILED_DIR") + project->first("TARGET") + "_pch_c" + Option::obj_ext;
        precompPchC = var("PRECOMPILED_DIR") + project->first("TARGET") + "_pch_c.pch";
        if (!project->isActiveConfig("clang_cl"))
            project->values("OBJECTS") += precompObjC;
        project->values("QMAKE_CLEAN") += precompPchC;
        project->values("PRECOMPILED_OBJECT_C") = ProStringList(precompObjC);
        project->values("PRECOMPILED_PCH_C")    = ProStringList(precompPchC);
    }

    const QFileInfo targetFileInfo(project->first("DESTDIR") + project->first("TARGET")
            + project->first("TARGET_EXT"));
    const ProString targetBase = targetFileInfo.path() + '/' + targetFileInfo.completeBaseName();
    if (project->first("TEMPLATE") == "lib" && project->isActiveConfig("shared")) {
        project->values("QMAKE_CLEAN").append(targetBase + ".exp");
        project->values("QMAKE_DISTCLEAN").append(targetBase + ".lib");
    }
    if (project->isActiveConfig("debug_info")) {
        QString pdbfile;
        QString distPdbFile = targetBase + ".pdb";
        if (project->isActiveConfig("staticlib")) {
            // For static libraries, the compiler's pdb file and the dist pdb file are the same.
            pdbfile = distPdbFile;
        } else {
            // Use $${TARGET}.vc.pdb in the OBJECTS_DIR for the compiler and
            // $${TARGET}.pdb (the default) for the linker.
            pdbfile = var("OBJECTS_DIR") + project->first("TARGET") + ".vc.pdb";
        }
        QString escapedPdbFile = escapeFilePath(pdbfile);
        project->values("QMAKE_CFLAGS").append("/Fd" + escapedPdbFile);
        project->values("QMAKE_CXXFLAGS").append("/Fd" + escapedPdbFile);
        project->values("QMAKE_CLEAN").append(pdbfile);
        project->values("QMAKE_DISTCLEAN").append(distPdbFile);
    }
    if (project->isActiveConfig("debug")) {
        project->values("QMAKE_CLEAN").append(targetBase + ".ilk");
        project->values("QMAKE_CLEAN").append(targetBase + ".idb");
    }

    if (project->values("QMAKE_APP_FLAG").isEmpty() && project->isActiveConfig("dll")) {
        ProStringList &defines = project->values("DEFINES");
        if (!defines.contains("_WINDLL"))
            defines.append("_WINDLL");
    }
}